

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O1

bool RigidBodyDynamics::InverseKinematics
               (Model *model,VectorNd *Qinit,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *body_id,
               vector<Vector3_t,_std::allocator<Vector3_t>_> *body_point,
               vector<Vector3_t,_std::allocator<Vector3_t>_> *target_pos,VectorNd *Qres,
               double step_tol,double lambda,uint max_iter)

{
  double *pdVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pVVar5;
  double *pdVar6;
  double dVar7;
  undefined8 uVar8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar9;
  Model *model_00;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *pvVar10;
  ulong uVar11;
  ulong uVar12;
  double *pdVar13;
  void *__ptr;
  undefined8 *puVar14;
  ulong uVar15;
  uint uVar16;
  Index othersize;
  long lVar17;
  Index *pIVar18;
  ActualDstType actualDst;
  Index *pIVar19;
  ulong uVar20;
  int iVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar22;
  double dVar23;
  Scalar SVar24;
  VectorNd z;
  VectorNd test_1;
  VectorNd e;
  VectorNd delta_theta;
  ActualDstType actualDst_1;
  MatrixNd JJTe_lambda2_I;
  VectorNd test_delta;
  MatrixNd J;
  MatrixNd G;
  bool local_1aa;
  scalar_sum_op<double,_double> local_1a9;
  undefined1 local_1a8 [16];
  undefined1 local_198 [24];
  long lStack_180;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_178;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_160;
  DenseStorage<double,__1,__1,__1,_0> local_158;
  double local_138;
  ulong local_130;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_128;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_118;
  Matrix<double,__1,__1,_0,__1,__1> local_100;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_e8;
  double local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  Model *local_80;
  ulong local_78;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *local_70;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *local_68;
  ulong local_60;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  local_e8.m_lhs.m_lhs =
       (LhsNested)
       (((long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2) * 3);
  local_e8.m_lhs.m_rhs.m_matrix = (non_const_type)(ulong)model->qdot_size;
  local_e8.m_rhs._0_8_ = 0;
  local_138 = lambda;
  local_90 = step_tol;
  local_70 = target_pos;
  local_68 = body_point;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_100,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_e8);
  lVar17 = ((long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(body_id->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start >> 2) * 3;
  local_198._16_8_ = (non_const_type)0x0;
  lStack_180 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_198 + 0x10),lVar17,1
            );
  if (lStack_180 != lVar17) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_198 + 0x10),lVar17
               ,1);
  }
  if (0 < lStack_180) {
    memset((void *)local_198._16_8_,0,lStack_180 << 3);
  }
  pdVar13 = (Qinit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  lVar17 = (Qinit->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      lVar17) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar17,1);
  }
  pdVar4 = (Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar11 = (Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar15 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar11) {
    lVar17 = 0;
    do {
      pdVar6 = pdVar13 + lVar17;
      dVar23 = pdVar6[1];
      pdVar1 = pdVar4 + lVar17;
      *pdVar1 = *pdVar6;
      pdVar1[1] = dVar23;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)uVar15);
  }
  if ((long)uVar15 < (long)uVar11) {
    do {
      pdVar4[uVar15] = pdVar13[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
  }
  local_1aa = max_iter != 0;
  if (local_1aa) {
    local_138 = local_138 * local_138;
    uVar11 = 0;
    local_160 = &Qres->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
    local_88 = body_id;
    local_80 = model;
    do {
      pvVar22 = local_88;
      local_78 = uVar11;
      UpdateKinematicsCustom(model,(VectorNd *)local_160,(VectorNd *)0x0,(VectorNd *)0x0);
      if ((pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
        local_130 = 0;
        do {
          uVar15 = local_130;
          local_e8.m_lhs.m_lhs = (LhsNested)0x0;
          local_e8.m_lhs.m_rhs.m_matrix = (non_const_type)0x0;
          local_e8.m_rhs._0_8_ = 0;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    ((DenseStorage<double,__1,__1,__1,_0> *)&local_e8,(ulong)model->qdot_size * 3,3,
                     (ulong)model->qdot_size);
          local_60 = uVar11;
          if (0 < (long)local_e8.m_lhs.m_rhs.m_matrix * local_e8.m_rhs._0_8_) {
            memset(local_e8.m_lhs.m_lhs,0,
                   (long)local_e8.m_lhs.m_rhs.m_matrix * local_e8.m_rhs._0_8_ * 8);
          }
          pvVar10 = local_68;
          model_00 = local_80;
          pPVar9 = local_160;
          CalcPointJacobian(local_80,(VectorNd *)local_160,
                            (pvVar22->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[uVar15],
                            (local_68->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>).
                            _M_impl.super__Vector_impl_data._M_start + uVar15,(MatrixNd *)&local_e8,
                            false);
          CalcBodyToBaseCoordinates
                    ((Vector3d *)&local_158,model_00,(VectorNd *)pPVar9,
                     (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar15],
                     (pvVar10->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>)._M_impl.
                     super__Vector_impl_data._M_start + uVar15,false);
          uVar20 = (ulong)model_00->qdot_size;
          pVVar5 = (local_70->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar21 = (int)local_60;
          uVar11 = local_60 & 0xffffffff;
          lVar17 = 0;
          pIVar19 = (Index *)local_e8.m_lhs.m_lhs;
          do {
            if (uVar20 != 0) {
              pdVar13 = local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data + uVar11;
              uVar12 = uVar20;
              pIVar18 = pIVar19;
              do {
                *pdVar13 = (double)*(void **)&((LhsNested)pIVar18)->
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                ;
                pIVar18 = (Index *)((long)&((LhsNested)pIVar18)->
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                   + (long)local_e8.m_lhs.m_rhs.m_matrix * 8);
                pdVar13 = pdVar13 + local_100.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_rows;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
            (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_198._16_8_)->
              m_storage).m_data)[(uint)((int)local_130 * 3 + (int)lVar17)] =
                 (double *)
                 (*(double *)
                   ((long)&pVVar5[uVar15].super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage +
                   lVar17 * 8) - (double)(&local_158.m_data)[lVar17]);
            lVar17 = lVar17 + 1;
            pIVar19 = pIVar19 + 1;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (lVar17 != 3);
          free(local_e8.m_lhs.m_lhs);
          local_130 = (ulong)((int)local_130 + 1);
          uVar11 = (ulong)(iVar21 + 3);
          model = local_80;
          pvVar22 = local_88;
        } while (local_130 <
                 (ulong)((long)(local_88->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_88->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 2));
      }
      local_158.m_data = (double *)(local_198 + 0x10);
      if (lStack_180 == 0) {
        dVar23 = 0.0;
      }
      else {
        local_e8.m_lhs.m_rhs.m_matrix = (non_const_type)local_198._16_8_;
        dVar23 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)&local_e8,(scalar_sum_op<double,_double> *)&local_128,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             *)&local_158);
      }
      pPVar9 = local_160;
      if (SQRT(dVar23) < local_90) break;
      local_e8.m_rhs.m_lhs.m_rows.m_value = lStack_180;
      local_e8.m_rhs.m_lhs.m_cols.m_value = lStack_180;
      local_e8.m_rhs.m_lhs.m_functor.m_other = local_138;
      local_e8.m_rhs.m_rhs.m_rows.m_value = lStack_180;
      local_e8.m_rhs.m_rhs.m_cols.m_value = lStack_180;
      local_158.m_data = (double *)0x0;
      local_158.m_rows = 0;
      local_158.m_cols = 0;
      local_e8.m_lhs.m_lhs = &local_100;
      local_e8.m_lhs.m_rhs.m_matrix = &local_100;
      if ((lStack_180 != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lStack_180),0) <
          lStack_180)) {
        puVar14 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar14 = operator_new;
        __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                (&local_158,lStack_180 * lStack_180,lStack_180,lStack_180);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_158,&local_e8,
                 (assign_op<double,_double> *)&local_128);
      lVar17 = (long)(pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2;
      uVar11 = lVar17 * 3;
      local_1a8._0_8_ = (double *)0x0;
      local_1a8._8_8_ = 0;
      pdVar13 = (double *)local_1a8._0_8_;
      if (uVar11 != 0) {
        free((void *)0x0);
        if (lVar17 < 1) {
          local_1a8._0_8_ = (double *)0x0;
          pdVar13 = (double *)local_1a8._0_8_;
        }
        else if ((0x1fffffffffffffff < uVar11) ||
                (pdVar13 = (double *)malloc(lVar17 * 0x18), pdVar13 == (double *)0x0)) {
          puVar14 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar14 = operator_new;
          __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      local_1a8._0_8_ = pdVar13;
      local_1a8._8_8_ = uVar11;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_48,&local_158);
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_58,(DenseStorage<double,__1,__1,_1,_0> *)(local_198 + 0x10));
      Math::LinSolveGaussElimPivot
                ((MatrixNd *)&local_48,(VectorNd *)&local_58,(VectorNd *)local_1a8);
      free(local_58.m_data);
      free(local_48.m_data);
      local_178.m_storage.m_data = (double *)0x0;
      local_178.m_storage.m_rows = 0;
      local_e8.m_lhs.m_lhs = &local_100;
      local_e8.m_lhs.m_rhs.m_matrix = (non_const_type)local_1a8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&local_178,
                 local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols,1);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_178,(SrcXprType *)&local_e8,
            (assign_op<double,_double> *)&local_128);
      pdVar4 = local_178.m_storage.m_data;
      pdVar13 = (pPVar9->m_storage).m_data;
      if ((pPVar9->m_storage).m_rows != local_178.m_storage.m_rows) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (pPVar9,local_178.m_storage.m_rows,1);
      }
      pdVar6 = (pPVar9->m_storage).m_data;
      uVar11 = (pPVar9->m_storage).m_rows;
      uVar15 = uVar11 - ((long)uVar11 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar11) {
        lVar17 = 0;
        do {
          pdVar1 = pdVar13 + lVar17;
          dVar7 = pdVar1[1];
          ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                     m_storage).m_data + lVar17;
          dVar23 = (double)ppdVar2[1];
          pdVar3 = pdVar6 + lVar17;
          *pdVar3 = *pdVar1 + (double)*ppdVar2;
          pdVar3[1] = dVar7 + dVar23;
          lVar17 = lVar17 + 2;
        } while (lVar17 < (long)uVar15);
      }
      if ((long)uVar15 < (long)uVar11) {
        do {
          pdVar6[uVar15] =
               pdVar13[uVar15] +
               (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pdVar4)->
                         m_storage).m_data)[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar11 != uVar15);
      }
      local_128.m_xpr = (XprTypeNested)&local_178;
      if (local_178.m_storage.m_rows == 0) {
        dVar23 = 0.0;
      }
      else {
        local_e8.m_lhs.m_rhs.m_matrix = (non_const_type)local_178.m_storage.m_data;
        dVar23 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)&local_e8,(scalar_sum_op<double,_double> *)local_198,&local_128);
      }
      uVar8 = local_1a8._8_8_;
      if (SQRT(dVar23) < local_90) {
        free(local_178.m_storage.m_data);
        free((void *)local_1a8._0_8_);
        free(local_158.m_data);
        break;
      }
      local_198._0_8_ = (double *)0x0;
      local_198._8_8_ = 0;
      pdVar13 = (double *)local_198._0_8_;
      if (local_1a8._8_8_ != 0) {
        free((void *)0x0);
        if ((long)uVar8 < 1) {
          local_198._0_8_ = (double *)0x0;
          pdVar13 = (double *)local_198._0_8_;
        }
        else if ((0x1fffffffffffffff < (ulong)uVar8) ||
                (pdVar13 = (double *)malloc(uVar8 * 8), pdVar13 == (double *)0x0)) {
          puVar14 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar14 = operator_new;
          __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      local_198._0_8_ = pdVar13;
      local_198._8_8_ = uVar8;
      if ((long)local_1a8._8_8_ < 1) {
        __ptr = (void *)0x0;
      }
      else if ((0x1fffffffffffffff < (ulong)local_1a8._8_8_) ||
              (__ptr = malloc(local_1a8._8_8_ << 3), __ptr == (void *)0x0)) {
        puVar14 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar14 = operator_new;
        __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if (0 < (long)uVar8) {
        memset((void *)local_198._0_8_,0,uVar8 << 3);
      }
      if (0 < (long)local_1a8._8_8_) {
        uVar16 = 1;
        uVar11 = 0;
        do {
          *(double *)(local_198._0_8_ + uVar11 * 8) = 1.0;
          local_e8.m_lhs.m_rhs.m_matrix = (non_const_type)local_198;
          local_118.m_storage.m_data = (double *)0x0;
          local_118.m_storage.m_rows = 0;
          local_e8.m_lhs.m_lhs = &local_100;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_118,
                     local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols,1);
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_118,(SrcXprType *)&local_e8,
                (assign_op<double,_double> *)&local_128);
          local_128.m_xpr = (XprTypeNested)&local_118;
          if (local_118.m_storage.m_rows == 0) {
            SVar24 = 0.0;
          }
          else {
            local_e8.m_lhs.m_rhs.m_matrix = (non_const_type)local_118.m_storage.m_data;
            SVar24 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_e8,&local_1a9,&local_128);
          }
          *(Scalar *)((long)__ptr + uVar11 * 8) = SVar24;
          *(double *)(local_198._0_8_ + uVar11 * 8) = 0.0;
          free(local_118.m_storage.m_data);
          uVar11 = (ulong)uVar16;
          uVar16 = uVar16 + 1;
        } while ((long)uVar11 < (long)local_1a8._8_8_);
      }
      free(__ptr);
      free((void *)local_198._0_8_);
      free(local_178.m_storage.m_data);
      free((void *)local_1a8._0_8_);
      free(local_158.m_data);
      uVar16 = (int)local_78 + 1;
      uVar11 = (ulong)uVar16;
      local_1aa = uVar16 < max_iter;
    } while (uVar16 != max_iter);
  }
  free((void *)local_198._16_8_);
  free(local_100.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return local_1aa;
}

Assistant:

RBDL_DLLAPI bool InverseKinematics (
    Model &model,
    const VectorNd &Qinit,
    const std::vector<unsigned int>& body_id,
    const std::vector<Vector3d>& body_point,
    const std::vector<Vector3d>& target_pos,
    VectorNd &Qres,
    double step_tol,
    double lambda,
    unsigned int max_iter) {
  assert (Qinit.size() == model.q_size);
  assert (body_id.size() == body_point.size());
  assert (body_id.size() == target_pos.size());

  MatrixNd J = MatrixNd::Zero(3 * body_id.size(), model.qdot_size);
  VectorNd e = VectorNd::Zero(3 * body_id.size());

  Qres = Qinit;

  for (unsigned int ik_iter = 0; ik_iter < max_iter; ik_iter++) {
    UpdateKinematicsCustom (model, &Qres, NULL, NULL);

    for (unsigned int k = 0; k < body_id.size(); k++) {
      MatrixNd G (MatrixNd::Zero(3, model.qdot_size));
      CalcPointJacobian (model, Qres, body_id[k], body_point[k], G, false);
      Vector3d point_base = 
        CalcBodyToBaseCoordinates (model, Qres, body_id[k], body_point[k], false);
      LOG << "current_pos = " << point_base.transpose() << std::endl;

      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < model.qdot_size; j++) {
          unsigned int row = k * 3 + i;
          LOG << "i = " << i << " j = " << j << " k = " << k << " row = " 
            << row << " col = " << j << std::endl;
          J(row, j) = G (i,j);
        }

        e[k * 3 + i] = target_pos[k][i] - point_base[i];
      }
    }

    LOG << "J = " << J << std::endl;
    LOG << "e = " << e.transpose() << std::endl;

    // abort if we are getting "close"
    if (e.norm() < step_tol) {
      LOG << "Reached target close enough after " << ik_iter << " steps" << std::endl;
      return true;
    }

    MatrixNd JJTe_lambda2_I = 
      J * J.transpose() 
      + lambda*lambda * MatrixNd::Identity(e.size(), e.size());

    VectorNd z (body_id.size() * 3);

    bool solve_successful = LinSolveGaussElimPivot (JJTe_lambda2_I, e, z);
    assert (solve_successful);

    LOG << "z = " << z << std::endl;

    VectorNd delta_theta = J.transpose() * z;
    LOG << "change = " << delta_theta << std::endl;

    Qres = Qres + delta_theta;
    LOG << "Qres = " << Qres.transpose() << std::endl;

    if (delta_theta.norm() < step_tol) {
      LOG << "reached convergence after " << ik_iter << " steps" << std::endl;
      return true;
    }

    VectorNd test_1 (z.size());
    VectorNd test_res (z.size());

    test_1.setZero();

    for (unsigned int i = 0; i < z.size(); i++) {
      test_1[i] = 1.;

      VectorNd test_delta = J.transpose() * test_1;

      test_res[i] = test_delta.squaredNorm();

      test_1[i] = 0.;
    }

    LOG << "test_res = " << test_res.transpose() << std::endl;
  }

  return false;
}